

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,
          initializer_list<soul::pool_ref<soul::heart::Expression>_> targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  Branch *t;
  pool_ref<soul::heart::Expression> *item;
  pool_ref<soul::heart::Expression> *a;
  long lVar1;
  pool_ptr<soul::heart::Block> local_38;
  
  item = targetArgs._M_array;
  t = Module::allocate<soul::heart::Branch,soul::heart::Block&>
                ((this->super_BlockBuilder).module,target);
  for (lVar1 = targetArgs._M_len << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&t->targetArgs,item);
    item = item + 1;
  }
  local_38 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,&t->super_Terminator,&local_38);
  return;
}

Assistant:

void addBranch (heart::Block& target, std::initializer_list<pool_ref<heart::Expression>> targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        for (auto& a : targetArgs)
            branch.targetArgs.push_back (a);

        addTerminatorStatement (branch, subsequentBlock);
    }